

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  
  pIVar5 = GImGui;
  if (layer == ImGuiNavLayer_Main) {
    pIVar3 = GImGui->NavWindow;
    pIVar7 = pIVar3->NavLastChildNavWindow;
    if ((pIVar7 == (ImGuiWindow *)0x0) || (pIVar7->WasActive == false)) {
      pIVar7 = pIVar3;
    }
    GImGui->NavWindow = pIVar7;
    if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar5->DebugLogFlags & 2) != 0)) {
      DebugLog("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n",pIVar3->Name,
               pIVar7->Name);
    }
  }
  pIVar6 = GImGui;
  pIVar3 = pIVar5->NavWindow;
  IVar2 = pIVar3->NavLastIds[layer];
  if (IVar2 != 0) {
    GImGui->NavId = IVar2;
    pIVar6->NavLayer = layer;
    pIVar6->NavFocusScopeId = 0;
    pIVar6->NavWindow->NavLastIds[layer] = IVar2;
    IVar4 = pIVar3->NavRectRel[layer].Max;
    pIVar1 = pIVar6->NavWindow->NavRectRel + layer;
    pIVar1->Min = pIVar3->NavRectRel[layer].Min;
    pIVar1->Max = IVar4;
    return;
  }
  pIVar5->NavLayer = layer;
  NavInitWindow(pIVar3,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
    {
        ImGuiWindow* prev_nav_window = g.NavWindow;
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);    // FIXME-NAV: Should clear ongoing nav requests?
        if (prev_nav_window)
            IMGUI_DEBUG_LOG_FOCUS("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n", prev_nav_window->Name, g.NavWindow->Name);
    }
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}